

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

bool __thiscall fasttext::Dictionary::readWord(Dictionary *this,istream *in,string *word)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  string *in_RDX;
  streambuf *sb;
  int c;
  
  std::ios::rdbuf();
  std::__cxx11::string::clear();
  while( true ) {
    while( true ) {
      iVar2 = std::streambuf::sbumpc();
      if (iVar2 == -1) {
        std::istream::get();
        bVar1 = std::__cxx11::string::empty();
        return (bool)((bVar1 ^ 0xff) & 1);
      }
      if ((((iVar2 == 0x20) || (iVar2 == 10)) || (iVar2 == 0xd)) ||
         (((iVar2 == 9 || (iVar2 == 0xb)) || ((iVar2 == 0xc || (iVar2 == 0)))))) break;
      std::__cxx11::string::push_back((char)in_RDX);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) break;
    if (iVar2 == 10) {
      std::__cxx11::string::operator+=(in_RDX,(string *)EOS_abi_cxx11_);
      return true;
    }
  }
  if (iVar2 == 10) {
    std::streambuf::sungetc();
  }
  return true;
}

Assistant:

bool Dictionary::readWord(std::istream& in, std::string& word) const
{
  int c;
  std::streambuf& sb = *in.rdbuf();
  word.clear();
  while ((c = sb.sbumpc()) != EOF) {
    if (c == ' ' || c == '\n' || c == '\r' || c == '\t' || c == '\v' ||
        c == '\f' || c == '\0') {
      if (word.empty()) {
        if (c == '\n') {
          word += EOS;
          return true;
        }
        continue;
      } else {
        if (c == '\n')
          sb.sungetc();
        return true;
      }
    }
    word.push_back(c);
  }
  // trigger eofbit
  in.get();
  return !word.empty();
}